

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_urlglob.c
# Opt level: O0

_Bool peek_ipv6(char *str,size_t *skip)

{
  byte bVar1;
  ushort **ppuVar2;
  size_t sVar3;
  ulong uStack_30;
  char c;
  size_t colons;
  size_t i;
  size_t *skip_local;
  char *str_local;
  
  uStack_30 = 0;
  colons = 1;
  if (*str == '[') {
    while( true ) {
      do {
        do {
          sVar3 = colons + 1;
          bVar1 = str[colons];
          ppuVar2 = __ctype_b_loc();
          colons = sVar3;
        } while (((*ppuVar2)[(int)(uint)bVar1] & 8) != 0);
      } while ((bVar1 == 0x2e) || (bVar1 == 0x25));
      if (bVar1 != 0x3a) break;
      uStack_30 = uStack_30 + 1;
    }
    if (bVar1 == 0x5d) {
      *skip = sVar3;
      str_local._7_1_ = 1 < uStack_30;
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

static bool peek_ipv6(const char *str, size_t *skip)
{
  /*
   * Scan for a potential IPv6 literal.
   * - Valid globs contain a hyphen and <= 1 colon.
   * - IPv6 literals contain no hyphens and >= 2 colons.
   */
  size_t i = 0;
  size_t colons = 0;
  if(str[i++] != '[') {
    return FALSE;
  }
  for(;;) {
    const char c = str[i++];
    if(ISALNUM(c) || c == '.' || c == '%') {
      /* ok */
    }
    else if(c == ':') {
      colons++;
    }
    else if(c == ']') {
      *skip = i;
      return colons >= 2 ? TRUE : FALSE;
    }
    else {
      return FALSE;
    }
  }
}